

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.h
# Opt level: O1

uint32_t mp_decode_array(char **data)

{
  byte bVar1;
  ushort uVar2;
  byte *pbVar3;
  uint uVar4;
  
  pbVar3 = (byte *)*data;
  bVar1 = *pbVar3;
  *data = (char *)(pbVar3 + 1);
  if ((bVar1 & 0x40) == 0) {
    uVar4 = bVar1 & 0xf;
  }
  else if ((bVar1 & 1) == 0) {
    uVar2 = *(ushort *)(pbVar3 + 1);
    *data = (char *)(pbVar3 + 3);
    uVar4 = (uint)(ushort)(uVar2 << 8 | uVar2 >> 8);
  }
  else {
    uVar4 = *(uint *)(pbVar3 + 1);
    uVar4 = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
    *data = (char *)(pbVar3 + 5);
  }
  return uVar4;
}

Assistant:

MP_IMPL MP_ALWAYSINLINE uint32_t
mp_decode_array(const char **data)
{
	uint8_t c = mp_load_u8(data);

	if (mp_likely(!(c & 0x40)))
		return (c & 0xf);

	return mp_decode_array_slowpath(c, data);
}